

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::LoadModifications(cmCTestP4 *this)

{
  vector<const_char_*,_std::allocator<const_char_*>_> p4_diff;
  string source;
  OutputLogger err;
  DiffParser out;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  LineParser local_188;
  DiffParser local_148;
  
  local_1c8._M_impl.super__Vector_impl_data._M_start = (char **)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1c8);
  local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x52553b;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_148);
  local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x525540;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_148);
  std::operator+(&local_1a8,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
  local_148.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)local_1a8._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_148);
  local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_148);
  DiffParser::DiffParser(&local_148,this,"p4_diff-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_188,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "p4_diff-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,local_1c8._M_impl.super__Vector_impl_data._M_start,
                      (OutputParser *)&local_148,&local_188.super_OutputParser,(char *)0x0);
  cmProcessTools::LineParser::~LineParser(&local_188);
  DiffParser::~DiffParser(&local_148);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_1c8);
  return;
}

Assistant:

void cmCTestP4::LoadModifications()
{
  std::vector<char const*> p4_diff;
  SetP4Options(p4_diff);

  p4_diff.push_back("diff");

  //Ideally we would use -Od but not all clients support it
  p4_diff.push_back("-dn");
  std::string source = this->SourceDirectory + "/...";
  p4_diff.push_back(source.c_str());
  p4_diff.push_back(0);

  DiffParser out(this, "p4_diff-out> ");
  OutputLogger err(this->Log, "p4_diff-err> ");
  this->RunChild(&p4_diff[0], &out, &err);
}